

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,LocalNameListStatement *l_namelist_stmt,void *data)

{
  bool bVar1;
  pointer pSVar2;
  long in_RSI;
  undefined8 in_RDI;
  NameListData name_list_data;
  ExpListData exp_list_data;
  NameListData local_28;
  ExpListData local_1c [3];
  long local_10;
  
  local_10 = in_RSI;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1e4c0b);
  if (bVar1) {
    ExpListData::ExpListData(local_1c);
    pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x1e4c29);
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,local_1c);
  }
  NameListData::NameListData(&local_28);
  pSVar2 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1e4c54);
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,in_RDI,&local_28);
  *(size_t *)(local_10 + 0x20) = local_28.name_count_;
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(LocalNameListStatement *l_namelist_stmt, void *data)
    {
        if (l_namelist_stmt->exp_list_)
        {
            ExpListData exp_list_data;
            l_namelist_stmt->exp_list_->Accept(this, &exp_list_data);
        }

        NameListData name_list_data;
        l_namelist_stmt->name_list_->Accept(this, &name_list_data);
        l_namelist_stmt->name_count_ = name_list_data.name_count_;
    }